

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O2

void __thiscall
SignalProcessing::FIRFilter::FIRFilter
          (FIRFilter *this,size_t number_of_taps,float input_sample_rate,float low_frequency,
          float high_frequency,float attenuation)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  allocator_type local_49;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  vector<float,_std::allocator<float>_> A;
  
  (this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 3;
  if (3 < number_of_taps) {
    uVar2 = number_of_taps;
  }
  local_48 = low_frequency;
  std::vector<short,_std::allocator<short>_>::resize(&this->filter_coefficients_,uVar2 | 1);
  std::vector<float,_std::allocator<float>_>::vector(&A,(uVar2 >> 1) + 1,&local_49);
  local_44 = 21.0;
  if (21.0 <= attenuation) {
    local_44 = attenuation;
  }
  local_3c = 2.0 / input_sample_rate;
  local_40 = input_sample_rate * 0.5;
  if (high_frequency <= input_sample_rate * 0.5) {
    local_40 = high_frequency;
  }
  *A.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       ((local_40 - local_48) + (local_40 - local_48)) / input_sample_rate;
  for (uVar1 = 1; uVar1 <= uVar2 >> 1; uVar1 = (ulong)((int)uVar1 + 1)) {
    fVar4 = local_3c * (float)uVar1 * 3.1415927;
    fVar3 = sinf(local_40 * fVar4);
    fVar4 = sinf(fVar4 * local_48);
    A.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar1] = (fVar3 - fVar4) / ((float)uVar1 * 3.1415927);
  }
  coefficients_for_idealised_filter_response
            ((this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start,
             A.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start,local_44,uVar2 | 1);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&A.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

FIRFilter::FIRFilter(std::size_t number_of_taps, float input_sample_rate, float low_frequency, float high_frequency, float attenuation) {
	// we must be asked to filter based on an odd number of
	// taps, and at least three
	if(number_of_taps < 3) number_of_taps = 3;
	if(attenuation < 21.0f) attenuation = 21.0f;

	// ensure we have an odd number of taps
	number_of_taps |= 1;

	// store instance variables
	filter_coefficients_.resize(number_of_taps);

	/* calculate idealised filter response */
	std::size_t Np = (number_of_taps - 1) / 2;
	float two_over_sample_rate = 2.0f / input_sample_rate;

	// Clamp the high cutoff frequency.
	high_frequency = std::min(high_frequency, input_sample_rate * 0.5f);

	std::vector<float> A(Np+1);
	A[0] = 2.0f * (high_frequency - low_frequency) / input_sample_rate;
	for(unsigned int i = 1; i <= Np; ++i) {
		float i_pi = float(i) * float(M_PI);
		A[i] =
			(
				sinf(two_over_sample_rate * i_pi * high_frequency) -
				sinf(two_over_sample_rate * i_pi * low_frequency)
			) / i_pi;
	}

	FIRFilter::coefficients_for_idealised_filter_response(filter_coefficients_.data(), A.data(), attenuation, number_of_taps);
}